

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

bool __thiscall SQGenerator::Resume(SQGenerator *this,SQVM *v,SQObjectPtr *dest)

{
  long lVar1;
  bool bVar2;
  SQUnsignedInteger SVar3;
  ulong uVar4;
  SQExceptionTrap *val;
  SQObjectPtr *pSVar5;
  SQObjectPtr *this_00;
  SQObject *local_88;
  bool local_71;
  long local_68;
  SQInteger n;
  SQObject _this;
  SQExceptionTrap *et;
  SQInteger i;
  SQInteger newbase;
  SQInteger target;
  SQInteger size;
  SQObjectPtr *dest_local;
  SQVM *v_local;
  SQGenerator *this_local;
  
  if (this->_state == eDead) {
    SQVM::Raise_Error(v,"resuming dead generator");
    this_local._7_1_ = false;
  }
  else if (this->_state == eRunning) {
    SQVM::Raise_Error(v,"resuming active generator");
    this_local._7_1_ = false;
  }
  else {
    SVar3 = sqvector<SQObjectPtr>::size(&this->_stack);
    uVar4 = (long)dest - (long)((v->_stack)._vals + v->_stackbase) >> 4;
    local_71 = 0xff < uVar4;
    if (local_71) {
      __assert_fail("target>=0 && target<=255",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/deps/squirrel/squirrel/sqobject.cpp"
                    ,0xab,"bool SQGenerator::Resume(SQVM *, SQObjectPtr &)");
    }
    lVar1 = v->_top;
    bVar2 = SQVM::EnterFrame(v,v->_top,v->_top + SVar3,false);
    if (bVar2) {
      v->ci->_generator = this;
      v->ci->_target = (SQInt32)uVar4;
      ::SQObjectPtr::operator=(&v->ci->_closure,&(this->_ci)._closure);
      v->ci->_ip = (this->_ci)._ip;
      v->ci->_literals = (this->_ci)._literals;
      v->ci->_ncalls = (this->_ci)._ncalls;
      v->ci->_etraps = (this->_ci)._etraps;
      v->ci->_root = (this->_ci)._root;
      for (et = (SQExceptionTrap *)0x0; (long)et < (long)(this->_ci)._etraps;
          et = (SQExceptionTrap *)((long)&et->_stackbase + 1)) {
        val = sqvector<SQExceptionTrap>::top(&this->_etraps);
        sqvector<SQExceptionTrap>::push_back(&v->_etraps,val);
        sqvector<SQExceptionTrap>::pop_back(&this->_etraps);
        _this._unVal.pTable = (SQTable *)sqvector<SQExceptionTrap>::back(&v->_etraps);
        ((_this._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
        _vptr_SQRefCounted =
             (_func_int **)
             (lVar1 + (long)((_this._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                            super_SQRefCounted._vptr_SQRefCounted);
        ((_this._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef =
             lVar1 + ((_this._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                     super_SQRefCounted._uiRef;
      }
      pSVar5 = (this->_stack)._vals;
      n = *(SQInteger *)&pSVar5->super_SQObject;
      _this._0_8_ = (pSVar5->super_SQObject)._unVal.pWeakRef;
      if ((int)n == 0x8010000) {
        local_88 = &((SQWeakRef *)_this._0_8_)->_obj;
      }
      else {
        local_88 = (SQObject *)&n;
      }
      pSVar5 = sqvector<SQObjectPtr>::operator[](&v->_stack,v->_stackbase);
      ::SQObjectPtr::operator=(pSVar5,local_88);
      for (local_68 = 1; local_68 < (long)SVar3; local_68 = local_68 + 1) {
        pSVar5 = (this->_stack)._vals;
        this_00 = sqvector<SQObjectPtr>::operator[](&v->_stack,v->_stackbase + local_68);
        ::SQObjectPtr::operator=(this_00,pSVar5 + local_68);
        ::SQObjectPtr::Null((this->_stack)._vals + local_68);
      }
      this->_state = eRunning;
      if ((v->_debughook & 1U) != 0) {
        SQVM::CallDebugHook(v,99,0);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool SQGenerator::Resume(SQVM *v,SQObjectPtr &dest)
{
    if(_state==eDead){ v->Raise_Error(_SC("resuming dead generator")); return false; }
    if(_state==eRunning){ v->Raise_Error(_SC("resuming active generator")); return false; }
    SQInteger size = _stack.size();
    SQInteger target = &dest - &(v->_stack._vals[v->_stackbase]);
    assert(target>=0 && target<=255);
    SQInteger newbase = v->_top;
    if(!v->EnterFrame(v->_top, v->_top + size, false))
        return false;
    v->ci->_generator   = this;
    v->ci->_target      = (SQInt32)target;
    v->ci->_closure     = _ci._closure;
    v->ci->_ip          = _ci._ip;
    v->ci->_literals    = _ci._literals;
    v->ci->_ncalls      = _ci._ncalls;
    v->ci->_etraps      = _ci._etraps;
    v->ci->_root        = _ci._root;


    for(SQInteger i=0;i<_ci._etraps;i++) {
        v->_etraps.push_back(_etraps.top());
        _etraps.pop_back();
        SQExceptionTrap &et = v->_etraps.back();
        // restore absolute stack base and size
        et._stackbase += newbase;
        et._stacksize += newbase;
    }
    SQObject _this = _stack._vals[0];
    v->_stack[v->_stackbase] = sq_type(_this) == OT_WEAKREF ? _weakref(_this)->_obj : _this;

    for(SQInteger n = 1; n<size; n++) {
        v->_stack[v->_stackbase+n] = _stack._vals[n];
        _stack._vals[n].Null();
    }

    _state=eRunning;
    if (v->_debughook)
        v->CallDebugHook(_SC('c'));

    return true;
}